

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::NextTransition
          (TimeZoneInfo *this,time_point<seconds> *tp,civil_transition *trans)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  detail *this_00;
  undefined3 uVar6;
  int_least8_t iVar7;
  int_least8_t iVar8;
  int_least8_t iVar9;
  int_least8_t iVar10;
  undefined3 uVar11;
  bool bVar12;
  size_type sVar13;
  const_reference pvVar14;
  civil_time<absl::time_internal::cctz::detail::second_tag> cVar15;
  uint_fast8_t local_b1;
  int_least64_t local_90;
  undefined8 local_88;
  uint_fast8_t prev_type_index;
  Transition *pTStack_78;
  Transition *tr;
  Transition target;
  int_fast64_t unix_time;
  Transition *end;
  Transition *begin;
  civil_transition *trans_local;
  time_point<seconds> *tp_local;
  TimeZoneInfo *this_local;
  
  bVar12 = std::
           vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
           ::empty(&this->transitions_);
  if (bVar12) {
    this_local._7_1_ = false;
  }
  else {
    end = std::
          vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
          ::operator[](&this->transitions_,0);
    sVar13 = std::
             vector<absl::time_internal::cctz::Transition,_std::allocator<absl::time_internal::cctz::Transition>_>
             ::size(&this->transitions_);
    pvVar14 = end + sVar13;
    if (end->unix_time < -0x7ffffffffffffff) {
      end = end + 1;
    }
    tr = (Transition *)ToUnixSeconds(tp);
    target.unix_time._0_1_ = 0;
    target.prev_civil_sec.f_._8_8_ = tr;
    detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
              ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&target.type_index);
    detail::civil_time<absl::time_internal::cctz::detail::second_tag>::civil_time
              ((civil_time<absl::time_internal::cctz::detail::second_tag> *)&target.civil_sec.f_.m);
    for (pTStack_78 = std::
                      upper_bound<absl::time_internal::cctz::Transition_const*,absl::time_internal::cctz::Transition,absl::time_internal::cctz::Transition::ByUnixTime>
                                (end,pvVar14,&tr); pTStack_78 != pvVar14;
        pTStack_78 = pTStack_78 + 1) {
      if (pTStack_78 == end) {
        local_b1 = this->default_transition_type_;
      }
      else {
        local_b1 = pTStack_78[-1].type_index;
      }
      bVar12 = EquivTransitions(this,local_b1,pTStack_78->type_index);
      if (!bVar12) break;
    }
    if (pTStack_78 == pvVar14) {
      this_local._7_1_ = false;
    }
    else {
      this_00 = (detail *)(pTStack_78->prev_civil_sec).f_.y;
      uVar1 = (pTStack_78->prev_civil_sec).f_.m;
      uVar2 = (pTStack_78->prev_civil_sec).f_.d;
      uVar3 = (pTStack_78->prev_civil_sec).f_.hh;
      uVar4 = (pTStack_78->prev_civil_sec).f_.mm;
      uVar5 = (pTStack_78->prev_civil_sec).f_.ss;
      uVar6 = *(undefined3 *)&(pTStack_78->prev_civil_sec).f_.field_0xd;
      cVar15.f_.y._5_3_ = uVar6;
      cVar15.f_.y._4_1_ = uVar5;
      cVar15.f_.y._3_1_ = uVar4;
      cVar15.f_.y._2_1_ = uVar3;
      cVar15.f_.y._1_1_ = uVar2;
      cVar15.f_.y._0_1_ = uVar1;
      cVar15.f_.m = '\x01';
      cVar15.f_.d = '\0';
      cVar15.f_.hh = '\0';
      cVar15.f_.mm = '\0';
      cVar15.f_.ss = '\0';
      cVar15.f_._13_3_ = 0;
      cVar15 = detail::operator+(this_00,cVar15,(diff_t)this_00);
      local_90 = cVar15.f_.y;
      (trans->from).f_.y = local_90;
      local_88 = cVar15.f_._8_8_;
      (trans->from).f_.m = (undefined1)local_88;
      (trans->from).f_.d = local_88._1_1_;
      (trans->from).f_.hh = local_88._2_1_;
      (trans->from).f_.mm = local_88._3_1_;
      (trans->from).f_.ss = local_88._4_1_;
      *(undefined3 *)&(trans->from).f_.field_0xd = local_88._5_3_;
      (trans->to).f_.y = (pTStack_78->civil_sec).f_.y;
      iVar7 = (pTStack_78->civil_sec).f_.d;
      iVar8 = (pTStack_78->civil_sec).f_.hh;
      iVar9 = (pTStack_78->civil_sec).f_.mm;
      iVar10 = (pTStack_78->civil_sec).f_.ss;
      uVar11 = *(undefined3 *)&(pTStack_78->civil_sec).f_.field_0xd;
      (trans->to).f_.m = (pTStack_78->civil_sec).f_.m;
      (trans->to).f_.d = iVar7;
      (trans->to).f_.hh = iVar8;
      (trans->to).f_.mm = iVar9;
      (trans->to).f_.ss = iVar10;
      *(undefined3 *)&(trans->to).f_.field_0xd = uVar11;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::NextTransition(const time_point<seconds>& tp,
                                  time_zone::civil_transition* trans) const {
  if (transitions_.empty()) return false;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + transitions_.size();
  if (begin->unix_time <= -(1LL << 59)) {
    // Do not report the BIG_BANG found in some zoneinfo data as it is
    // really a sentinel, not a transition.  See pre-2018f tz/zic.c.
    ++begin;
  }
  std::int_fast64_t unix_time = ToUnixSeconds(tp);
  const Transition target = {unix_time, 0, civil_second(), civil_second()};
  const Transition* tr =
      std::upper_bound(begin, end, target, Transition::ByUnixTime());
  for (; tr != end; ++tr) {  // skip no-op transitions
    std::uint_fast8_t prev_type_index =
        (tr == begin) ? default_transition_type_ : tr[-1].type_index;
    if (!EquivTransitions(prev_type_index, tr[0].type_index)) break;
  }
  // When tr == end we return false, ignoring future_spec_.
  if (tr == end) return false;
  trans->from = tr->prev_civil_sec + 1;
  trans->to = tr->civil_sec;
  return true;
}